

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_transaction.cpp
# Opt level: O2

void __thiscall
TransactionApi_FundRawTransaction_MillionAmountValue_Test::TestBody
          (TransactionApi_FundRawTransaction_MillionAmountValue_Test *this)

{
  Txid *this_00;
  Txid *this_01;
  Txid *this_02;
  bool bVar1;
  uint32_t uVar2;
  char *pcVar3;
  long lVar4;
  Amount AVar5;
  initializer_list<cfd::UtxoData> __l;
  allocator local_24f2;
  allocator local_24f1;
  AssertionResult gtest_ar_2;
  Privkey local_24d0;
  TransactionApi api;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_24a8;
  uint32_t minimum_fee;
  undefined4 uStack_248c;
  ByteData tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  Amount estimate_fee;
  SigHashType local_2414;
  SigHashType local_2408;
  SigHashType local_23fc;
  AddressFactory factory;
  Amount target_value;
  Amount fee;
  TransactionContext txc;
  Address address;
  TransactionController tx_obj;
  CoinSelectionOption option;
  AssertionResult gtest_ar;
  UtxoData local_1bd0;
  UtxoData local_16e0;
  UtxoData utxo3;
  UtxoData utxo2;
  Address address2;
  UtxoData utxo1;
  Address address3;
  
  cfd::AddressFactory::AddressFactory(&factory,kRegtest);
  cfd::UtxoData::UtxoData(&utxo1);
  utxo1.block_height = 0;
  utxo1.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo2,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&utxo3);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo2);
  this_00 = &utxo1.txid;
  cfd::core::Txid::operator=(this_00,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  utxo1.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo2,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",
             (allocator *)&utxo3);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo2);
  cfd::core::Script::operator=(&utxo1.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::string
            ((string *)&utxo2,"n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW",(allocator *)&utxo3);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&utxo2);
  cfd::core::Address::operator=(&utxo1.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo2);
  std::__cxx11::string::assign((char *)&utxo1.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,300000000000000);
  utxo1.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo1.amount.amount_ = gtest_ar._0_8_;
  utxo1.address_type = kP2pkhAddress;
  cfd::UtxoData::UtxoData(&utxo2);
  utxo2.block_height = 0;
  utxo2.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&utxo3,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&utxo3);
  this_01 = &utxo2.txid;
  cfd::core::Txid::operator=(this_01,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  utxo2.vout = 0;
  std::__cxx11::string::string
            ((string *)&utxo3,"a9145d54db96a28f844a744e393fcd699d6f825b284187",(allocator *)&address
            );
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&utxo3);
  cfd::core::Script::operator=(&utxo2.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::string
            ((string *)&utxo3,"2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16",(allocator *)&address);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&utxo3);
  cfd::core::Address::operator=(&utxo2.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&utxo3);
  std::__cxx11::string::assign((char *)&utxo2.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,400000000000000);
  utxo2.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo2.amount.amount_ = gtest_ar._0_8_;
  utxo2.address_type = kP2shP2wpkhAddress;
  cfd::UtxoData::UtxoData(&utxo3);
  utxo3.block_height = 0;
  utxo3.binary_data = (void *)0x0;
  std::__cxx11::string::string
            ((string *)&address,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             (allocator *)&address2);
  cfd::core::Txid::Txid((Txid *)&gtest_ar,(string *)&address);
  this_02 = &utxo3.txid;
  cfd::core::Txid::operator=(this_02,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  utxo3.vout = 1;
  std::__cxx11::string::string
            ((string *)&address,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",
             (allocator *)&address2);
  cfd::core::Script::Script((Script *)&gtest_ar,(string *)&address);
  cfd::core::Script::operator=(&utxo3.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::string
            ((string *)&address,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",
             (allocator *)&address2);
  cfd::AddressFactory::GetAddress((Address *)&gtest_ar,&factory,(string *)&address);
  cfd::core::Address::operator=(&utxo3.address,(Address *)&gtest_ar);
  cfd::core::Address::~Address((Address *)&gtest_ar);
  std::__cxx11::string::~string((string *)&address);
  std::__cxx11::string::assign((char *)&utxo3.descriptor);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,300000000000000);
  utxo3.amount.ignore_check_ = (bool)gtest_ar.message_.ptr_._0_1_;
  utxo3.amount.amount_ = gtest_ar._0_8_;
  utxo3.address_type = kP2wpkhAddress;
  std::__cxx11::string::string
            ((string *)&gtest_ar,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo",(allocator *)&address2);
  cfd::core::Address::Address(&address,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu",
             (allocator *)&address3);
  cfd::core::Address::Address(&address2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w",(allocator *)&txc);
  cfd::core::Address::Address(&address3,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Amount::Amount(&fee,10000);
  cfd::TransactionContext::TransactionContext(&txc,2,0);
  AVar5 = cfd::core::operator+(&utxo1.amount,&utxo3.amount);
  option._0_8_ = AVar5.amount_;
  option.change_spend_size_._0_1_ = AVar5.ignore_check_;
  AVar5 = cfd::core::operator-((Amount *)&option,&fee);
  gtest_ar._0_8_ = AVar5.amount_;
  gtest_ar.message_.ptr_._0_1_ = AVar5.ignore_check_;
  cfd::TransactionContext::AddTxOut(&txc,&address,(Amount *)&gtest_ar);
  cfd::TransactionContext::AddTxOut(&txc,&address2,&utxo2.amount);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo1);
  cfd::UtxoData::UtxoData(&local_1bd0,&utxo2);
  cfd::UtxoData::UtxoData(&local_16e0,&utxo3);
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&utxos,__l,(allocator_type *)&option);
  lVar4 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(&gtest_ar.success_ + lVar4));
    lVar4 = lVar4 + -0x4f0;
  } while (lVar4 != -0x4f0);
  cfd::CoinSelectionOption::CoinSelectionOption(&option);
  selected_txin_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  selected_txin_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  selected_txin_utxos.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Amount::Amount(&target_value);
  cfd::core::Amount::Amount(&estimate_fee);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&txc)
  ;
  cfd::core::Address::GetAddress_abi_cxx11_((string *)&gtest_ar_2,&address3);
  cfd::api::TransactionApi::FundRawTransaction
            (&tx_obj,&api,(string *)&gtest_ar,&utxos,&target_value,&selected_txin_utxos,
             (string *)&gtest_ar_2,20.0,&estimate_fee,(UtxoFilter *)0x0,&option,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,kCfdIllegalStateError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  std::__cxx11::string::~string((string *)&gtest_ar);
  gtest_ar_2._0_8_ = cfd::core::Amount::GetSatoshiValue(&estimate_fee);
  local_24d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_24d0.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x20a8);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"estimate_fee.GetSatoshiValue()","8360",(long *)&gtest_ar_2,
             (int *)&local_24d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)&gtest_ar_2,&tx_obj.super_AbstractTransactionController);
  cfd::TransactionContext::TransactionContext((TransactionContext *)&gtest_ar,(string *)&gtest_ar_2)
  ;
  cfd::TransactionContext::operator=(&txc,(TransactionContext *)&gtest_ar);
  cfd::TransactionContext::~TransactionContext((TransactionContext *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::CollectInputUtxo(&txc,&utxos);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0xfa,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  cfd::core::ByteData::ByteData(&tx);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_2,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_24f1);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_24a8,(string *)&gtest_ar_2);
      std::__cxx11::string::string
                ((string *)&minimum_fee,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_24f2);
      cfd::core::Privkey::FromWif(&local_24d0,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_23fc);
      cfd::TransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_24a8,&local_24d0,&local_23fc,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_24d0);
      std::__cxx11::string::~string((string *)&minimum_fee);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_24a8);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x101,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_00,utxo1.vout);
      cfd::TransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x102,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::TransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x103,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_01,utxo2.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_2,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",&local_24f1);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_24a8,(string *)&gtest_ar_2);
      std::__cxx11::string::string
                ((string *)&minimum_fee,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 &local_24f2);
      cfd::core::Privkey::FromWif(&local_24d0,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2408);
      cfd::TransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_24a8,&local_24d0,&local_2408,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_24d0);
      std::__cxx11::string::~string((string *)&minimum_fee);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_24a8);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x108,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_01,utxo2.vout);
      cfd::TransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x109,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::TransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&gtest_ar);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
             ,0x10a,
             "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_02,utxo3.vout);
      std::__cxx11::string::string
                ((string *)&gtest_ar_2,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_24f1);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_24a8,(string *)&gtest_ar_2);
      std::__cxx11::string::string
                ((string *)&minimum_fee,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_24f2);
      cfd::core::Privkey::FromWif(&local_24d0,(string *)&minimum_fee,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2414);
      cfd::TransactionContext::SignWithKey
                (&txc,(OutPoint *)&gtest_ar,(Pubkey *)&local_24a8,&local_24d0,&local_2414,true,
                 (ByteData256 *)0x0,(ByteData *)0x0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_24d0);
      std::__cxx11::string::~string((string *)&minimum_fee);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_24a8);
      std::__cxx11::string::~string((string *)&gtest_ar_2);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x10f,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&gtest_ar,this_02,utxo3.vout);
      cfd::TransactionContext::Verify(&txc,(OutPoint *)&gtest_ar);
      cfd::core::Txid::~Txid((Txid *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x110,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::TransactionContext::Finalize((ByteData *)&gtest_ar,&txc);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x112,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  AVar5 = cfd::TransactionContext::GetFeeAmount(&txc);
  gtest_ar_2._0_8_ = AVar5.amount_;
  gtest_ar_2.message_.ptr_._0_1_ = AVar5.ignore_check_;
  local_24d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)&gtest_ar_2);
  _minimum_fee = (pointer)cfd::core::Amount::GetSatoshiValue(&estimate_fee);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar,"txc.GetFeeAmount().GetSatoshiValue()",
             "estimate_fee.GetSatoshiValue()",(long *)&local_24d0,(long *)&minimum_fee);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x113,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar,&tx);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"tx.GetHex().c_str()",
             "\"02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000\""
             ,(char *)gtest_ar._0_8_,
             "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000"
            );
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar_2.message_.ptr_._1_7_,gtest_ar_2.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x114,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d0,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  uVar2 = cfd::core::Transaction::GetVsize(&txc.super_Transaction);
  gtest_ar_2._0_4_ = uVar2;
  local_24d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_24d0.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x19d);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"txc.GetVsize()","413",(uint *)&gtest_ar_2,(int *)&local_24d0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x115,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar2 = cfd::core::Transaction::GetVsize(&txc.super_Transaction);
  minimum_fee = uVar2 * 0x14;
  gtest_ar_2._0_4_ = 0x2044;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"minimum_fee","8260",&minimum_fee,(int *)&gtest_ar_2);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)CONCAT71(gtest_ar.message_.ptr_._1_7_,gtest_ar.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_24d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_transaction.cpp"
               ,0x118,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_24d0,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_24d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
  cfd::TransactionController::~TransactionController(&tx_obj);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&selected_txin_utxos);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&option.fee_asset_);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&utxos);
  cfd::TransactionContext::~TransactionContext(&txc);
  cfd::core::Address::~Address(&address3);
  cfd::core::Address::~Address(&address2);
  cfd::core::Address::~Address(&address);
  cfd::UtxoData::~UtxoData(&utxo3);
  cfd::UtxoData::~UtxoData(&utxo2);
  cfd::UtxoData::~UtxoData(&utxo1);
  cfd::AddressFactory::~AddressFactory(&factory);
  return;
}

Assistant:

TEST(TransactionApi, FundRawTransaction_MillionAmountValue) {
  AddressFactory factory(NetType::kRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("n3gq7EMkVLyrpSxVxKLFX8qsqiDC5DcqfW");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{300000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("2N1kiV9NkmZetZ3j7FuWGkBZxubBMPLxJ16");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{400000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{300000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");
  Address address3("bcrt1q7vcwmqurlzhae9mamzrqp6u07yst590y5ujv3w");

  Amount fee(int64_t{10000});
  TransactionContext txc(2, 0);
  txc.AddTxOut(address, utxo1.amount + utxo3.amount - fee);
  txc.AddTxOut(address2, utxo2.amount);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  double effective_fee_rate = 20.0;
  CoinSelectionOption option;
  std::vector<UtxoData> selected_txin_utxos;
  Amount target_value;
  Amount estimate_fee;


  TransactionApi api;
  auto tx_obj = api.FundRawTransaction(
      txc.GetHex(), utxos, target_value, selected_txin_utxos, address3.GetAddress(),
      effective_fee_rate, &estimate_fee, nullptr, &option, nullptr, NetType::kRegtest);
  EXPECT_EQ(estimate_fee.GetSatoshiValue(), 8360);

  txc = TransactionContext(tx_obj.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "02000000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a4730440220644d3014684db32df93e6e342e2d0872aa6272d3a9cdce021138592ef78fc2a8022054a2a85c6339dee9578d9989920100f0660bd45b9cf7b14444f012bf5ee0bd7601210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff03f058dd62b22102001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0000e941cc6b010016001445663e592ff613587f0fdd6e74034c5239710dca6806000000000000160014f330ed8383f8afdc977dd88600eb8ff120ba15e40247304402202ece1dae47832c07863b5052133c9af652e9521e0fbaf4ef7558ca45ec739ca902205ad29147c0f5f16277a7a00391f8b5d43b9b6c149721cdb4591ba18c701dbd5f01210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2702473044022058e88c67379c5b5c49dfef09eb069833ba9ae7cd6f8a5f9bdcf657ed8ad91b820220039739df97dc8488a93f61000cbade6d48df737238519660a02071795aabd74801210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000");
  EXPECT_EQ(txc.GetVsize(), 413);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(effective_fee_rate);
  EXPECT_EQ(minimum_fee, 8260);
}